

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::set_htt_hmixTYP(PeleLM *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var7;
  MultiFab *src;
  pointer pIVar8;
  pointer ppVar9;
  double *pdVar10;
  Long LVar11;
  Long LVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ostream *poVar17;
  Print *pPVar18;
  long lVar19;
  long lVar20;
  int j;
  int iVar21;
  long lVar22;
  void *__s;
  ulong uVar23;
  long lVar24;
  Real RVar25;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  MFIter mfi;
  Array4<double> local_280;
  BoxArray baf;
  Box local_1d4;
  MultiFab hmix;
  
  htt_hmixTYP = typical_values.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[RhoH];
  if ((htt_hmixTYP != -10000000000.0) || (NAN(htt_hmixTYP))) {
    if (1 < NavierStokesBase::verbose) {
      poVar17 = amrex::OutStream();
      amrex::Print::Print((Print *)&hmix,poVar17);
      std::operator<<((ostream *)
                      &hmix.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                       m_bndryReg.m_typ,"     setting htt_hmixTYP(from user input) = ");
      pPVar18 = amrex::Print::operator<<((Print *)&hmix,&htt_hmixTYP);
      std::operator<<((ostream *)&pPVar18->ss,'\n');
      amrex::Print::~Print((Print *)&hmix);
    }
  }
  else {
    uVar1 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                      super_AmrMesh.super_AmrInfo.field_0x8c;
    htt_hmixTYP = 0.0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar23 = 0; (long)uVar23 <= (long)(int)uVar1; uVar23 = uVar23 + 1) {
      _Var7.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar23]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      src = *(MultiFab **)
             (*(long *)((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170)
             + 200);
      baf.m_bat._0_8_ = 1;
      baf.m_bat.m_op._20_8_ = 0;
      baf.m_bat.m_op._28_8_ = 0;
      baf.m_bat.m_op._4_8_ = 0;
      baf.m_bat.m_op._12_8_ = 0;
      amrex::MultiFab::MultiFab
                (&hmix,(BoxArray *)
                       ((long)_Var7.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
                 (DistributionMapping *)
                 ((long)_Var7.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,0,
                 (MFInfo *)&baf,
                 (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(baf.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
      amrex::MultiFab::Copy(&hmix,src,RhoH,0,1,0);
      amrex::MultiFab::Divide(&hmix,src,3,0,1,0);
      if (uVar23 != uVar1) {
        amrex::BoxArray::BoxArray
                  (&baf,(BoxArray *)
                        ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar23 + 1]._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0xd8));
        pIVar8 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                 super_AmrMesh.super_AmrInfo.ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
               *)pIVar8[uVar23].vect;
        mfi.fabArray._0_4_ = pIVar8[uVar23].vect[2];
        amrex::BoxArray::coarsen(&baf,(IntVect *)&mfi);
        amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&hmix,true);
        while (mfi.currentIndex < mfi.endIndex) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_280,&hmix.super_FabArray<amrex::FArrayBox>,&mfi);
          amrex::BoxArray::operator[]
                    (&local_1d4,
                     (BoxArray *)
                     ((long)_Var7.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8),
                     ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[mfi.currentIndex]);
          amrex::BoxArray::intersections(&baf,&local_1d4,&isects);
          iVar13 = local_280.begin.z;
          LVar12 = local_280.kstride;
          LVar11 = local_280.jstride;
          pdVar10 = local_280.p;
          ppVar9 = isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = (long)isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = (long)local_280.begin.x;
          lVar20 = (long)local_280.begin.y;
          lVar24 = local_280.jstride * 8;
          for (lVar16 = 0; lVar16 != lVar19 >> 5; lVar16 = lVar16 + 1) {
            iVar2 = ppVar9[lVar16].second.smallend.vect[0];
            iVar3 = ppVar9[lVar16].second.smallend.vect[1];
            iVar21 = ppVar9[lVar16].second.smallend.vect[2];
            iVar4 = ppVar9[lVar16].second.bigend.vect[0];
            iVar5 = ppVar9[lVar16].second.bigend.vect[1];
            iVar6 = ppVar9[lVar16].second.bigend.vect[2];
            iVar14 = iVar21 - iVar13;
            for (lVar22 = (long)iVar21; lVar22 <= iVar6; lVar22 = lVar22 + 1) {
              __s = (void *)((long)pdVar10 +
                            (iVar14 * LVar12 + (long)iVar2) * 8 +
                            (iVar3 - lVar20) * lVar24 + lVar15 * -8);
              for (iVar21 = iVar3; iVar21 <= iVar5; iVar21 = iVar21 + 1) {
                if (iVar2 <= iVar4) {
                  memset(__s,0,(ulong)(uint)(iVar4 - iVar2) * 8 + 8);
                }
                __s = (void *)((long)__s + LVar11 * 8);
              }
              iVar14 = iVar14 + 1;
            }
          }
          amrex::MFIter::operator++(&mfi);
        }
        amrex::MFIter::~MFIter(&mfi);
        amrex::BoxArray::~BoxArray(&baf);
      }
      RVar25 = amrex::MultiFab::norm0(&hmix,0,0,false,false);
      if (RVar25 <= htt_hmixTYP) {
        RVar25 = htt_hmixTYP;
      }
      htt_hmixTYP = RVar25;
      amrex::MultiFab::~MultiFab(&hmix);
    }
    if (1 < NavierStokesBase::verbose) {
      poVar17 = amrex::OutStream();
      amrex::Print::Print((Print *)&hmix,poVar17);
      std::operator<<((ostream *)
                      &hmix.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                       m_bndryReg.m_typ,"     setting htt_hmixTYP(via domain scan) = ");
      pPVar18 = amrex::Print::operator<<((Print *)&hmix,&htt_hmixTYP);
      std::operator<<((ostream *)&pPVar18->ss,'\n');
      amrex::Print::~Print((Print *)&hmix);
    }
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
  }
  return;
}

Assistant:

void
PeleLM::set_htt_hmixTYP ()
{
   const int finest_level = parent->finestLevel();

   // set typical value for hmix, needed for TfromHY solves if not provided explicitly
   if (typical_values[RhoH]==typical_RhoH_value_default)
   {
      htt_hmixTYP = 0;
      std::vector< std::pair<int,Box> > isects;
      for (int lvl = 0; lvl <= finest_level; lvl++)
      {
         AmrLevel&       ht = getLevel(lvl);
         const MultiFab& S  = ht.get_new_data(State_Type);
         const BoxArray& ba = ht.boxArray();
         const DistributionMapping& dm = ht.DistributionMap();
         MultiFab hmix(ba,dm,1,0,MFInfo(),Factory());
         MultiFab::Copy(hmix,S,RhoH,0,1,0);
         MultiFab::Divide(hmix,S,Density,0,1,0);
         if (lvl != finest_level)
         {
            AmrLevel& htf = getLevel(lvl+1);
            BoxArray  baf = htf.boxArray();
            baf.coarsen(parent->refRatio(lvl));
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(hmix,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               auto const& h_mix = hmix.array(mfi);
               baf.intersections(ba[mfi.index()],isects);
               for (long unsigned int is = 0; is < isects.size(); is++) {
                  amrex::ParallelFor(isects[is].second, [h_mix]
                  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                  {
                     h_mix(i,j,k) = 0.0;
                  });
               }
            }
         }
         htt_hmixTYP = std::max(htt_hmixTYP,hmix.norm0(0));
      }
      ParallelDescriptor::ReduceRealMax(htt_hmixTYP);
      if (verbose > 1)
      amrex::Print() << "     setting htt_hmixTYP(via domain scan) = " << htt_hmixTYP << '\n';
   }
   else
   {
      htt_hmixTYP = typical_values[RhoH];
      if (verbose > 1)
         amrex::Print() << "     setting htt_hmixTYP(from user input) = " << htt_hmixTYP << '\n';
   }
}